

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeRecordCompareWithSkip(int nKey1,void *pKey1,UnpackedRecord *pPKey2,int bSkip)

{
  double dVar1;
  uint uVar2;
  FuncDef *pFVar3;
  bool bVar4;
  uint uVar5;
  u8 uVar6;
  byte bVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  ushort uVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  undefined4 uVar17;
  ulong uVar18;
  ulong uVar19;
  Mem *pMem2;
  uint uVar20;
  uint uVar21;
  u32 szHdr1;
  Mem mem1;
  uint local_ac;
  Mem *local_a8;
  uint local_a0;
  int local_9c;
  ulong local_98;
  uint local_8c;
  u8 *local_88;
  double local_80;
  long local_78;
  long local_70;
  MemValue local_68;
  long local_60;
  uint local_58;
  undefined2 local_54;
  u8 local_52;
  sqlite3 *local_50;
  
  pMem2 = pPKey2->aMem;
  if (bSkip == 0) {
    local_8c = (uint)*pKey1;
    uVar18 = 1;
    if ((char)*pKey1 < '\0') {
      bVar7 = sqlite3GetVarint32((uchar *)pKey1,&local_8c);
      uVar18 = (ulong)bVar7;
    }
    uVar20 = 0;
    uVar15 = local_8c;
  }
  else {
    local_68.nZero = (int)*(byte *)((long)pKey1 + 1);
    uVar18 = 2;
    if ((char)*(byte *)((long)pKey1 + 1) < '\0') {
      uVar6 = sqlite3GetVarint32((uchar *)((long)pKey1 + 1),(u32 *)&local_68.nZero);
      uVar18 = (ulong)(byte)(uVar6 + 1);
    }
    local_8c = (uint)*pKey1;
    if ((ulong)(uint)local_68.nZero < 0x80) {
      uVar15 = (uint)""[(uint)local_68.nZero];
    }
    else {
      uVar15 = local_68.nZero - 0xcU >> 1;
    }
    pMem2 = pMem2 + 1;
    uVar20 = 1;
    uVar15 = uVar15 + local_8c;
  }
  uVar5 = local_8c;
  if ((uint)nKey1 < uVar15) {
    iVar16 = 0;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x14cfc,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    pPKey2->errCode = '\v';
  }
  else {
    local_88 = &pPKey2->errCode;
    uVar14 = 0;
    local_a0 = nKey1;
LAB_00143c07:
    uVar13 = pMem2->flags;
    uVar17 = (undefined4)uVar18;
    if ((uVar13 & 0x24) == 0) {
      if ((uVar13 & 8) != 0) {
        local_ac = (uint)*(byte *)((long)pKey1 + uVar18);
        uVar19 = 1;
        nKey1 = local_a0;
        if (local_ac < 10) {
          uVar11 = (uint)*(byte *)((long)pKey1 + uVar18);
          if (uVar11 == 0) {
            uVar19 = 0xffffffff;
          }
          else {
            local_a8 = (Mem *)CONCAT44(local_a8._4_4_,uVar17);
            local_98 = uVar14;
            sqlite3VdbeSerialGet((uchar *)((ulong)uVar15 + (long)pKey1),uVar11,(Mem *)&local_68);
            dVar1 = (pMem2->u).r;
            nKey1 = local_a0;
            if (uVar11 == 7) {
              if (dVar1 <= (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
                uVar18 = (ulong)local_a8 & 0xffffffff;
                if ((double)CONCAT44(local_68.i._4_4_,local_68.nZero) <= dVar1) {
                  uVar19 = local_98;
                }
              }
              else {
                uVar18 = (ulong)local_a8 & 0xffffffff;
                uVar19 = 0xffffffff;
              }
            }
            else {
              local_78 = CONCAT44(local_68.i._4_4_,local_68.nZero);
              uVar19 = (ulong)(dVar1 < (double)local_78);
              if ((double)local_78 < dVar1) {
                uVar19 = 0xffffffff;
              }
              uVar18 = (ulong)local_a8 & 0xffffffff;
              local_80 = dVar1;
            }
          }
        }
        goto LAB_001440c3;
      }
      if ((uVar13 & 2) == 0) {
        bVar7 = *(byte *)((long)pKey1 + uVar18);
        local_ac = (uint)bVar7;
        if ((uVar13 & 0x10) == 0) {
          uVar19 = (ulong)(bVar7 != 0);
        }
        else {
          if ((char)bVar7 < '\0') {
            local_a8 = (Mem *)CONCAT44(local_a8._4_4_,uVar17);
            local_98 = uVar14;
            sqlite3GetVarint32((uchar *)(uVar18 + (long)pKey1),&local_ac);
            uVar18 = (ulong)local_a8 & 0xffffffff;
            uVar14 = local_98;
          }
          uVar19 = 0xffffffff;
          if ((local_ac & 1) == 0 && 0xb < local_ac) {
            uVar21 = local_ac - 0xc >> 1;
            uVar11 = uVar15 + uVar21;
            local_a8 = (Mem *)pPKey2;
            if ((uint)nKey1 < uVar11) {
              local_9c = 0;
              local_98 = CONCAT44(local_98._4_4_,uVar11);
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x14d67,
                          "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
              *(u8 *)((long)&local_a8->db + 7) = '\v';
              uVar14 = uVar14 & 0xffffffff;
              uVar11 = (uint)local_98;
            }
            else if ((pMem2->flags & 0x400) == 0) {
              uVar2 = pMem2->n;
              uVar8 = uVar2;
              if ((int)uVar21 < (int)uVar2) {
                uVar8 = uVar21;
              }
              uVar8 = memcmp((void *)((ulong)uVar15 + (long)pKey1),pMem2->z,(long)(int)uVar8);
              uVar21 = uVar21 - uVar2;
              if (uVar8 != 0) {
                uVar21 = uVar8;
              }
              uVar14 = (ulong)uVar21;
              nKey1 = local_a0;
            }
            else {
              if (local_ac - 0xc != 0) {
                uVar14 = 0;
                do {
                  if (*(char *)((long)pKey1 + uVar14 + uVar15) != '\0') {
                    uVar14 = 1;
                    goto LAB_001441f0;
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar21 != uVar14);
              }
              uVar14 = (ulong)(uVar21 - (pMem2->u).nZero);
            }
LAB_001441f0:
            iVar16 = 1;
            pPKey2 = (UnpackedRecord *)local_a8;
            uVar19 = uVar14;
            if ((uint)nKey1 < uVar11) goto LAB_00144170;
          }
        }
        goto LAB_001440c3;
      }
      local_ac = (uint)*(byte *)((long)pKey1 + uVar18);
      if ((char)*(byte *)((long)pKey1 + uVar18) < '\0') {
        local_a8 = (Mem *)CONCAT44(local_a8._4_4_,uVar17);
        local_98 = uVar14;
        sqlite3GetVarint32((uchar *)(uVar18 + (long)pKey1),&local_ac);
        uVar18 = (ulong)local_a8 & 0xffffffff;
        uVar14 = local_98;
      }
      uVar19 = 0xffffffff;
      if ((local_ac < 0xc) || (uVar19 = 1, (local_ac & 1) == 0)) goto LAB_001440c3;
      local_58 = local_ac - 0xc >> 1;
      if ((local_58 + uVar15 <= (uint)nKey1) &&
         (pFVar3 = (((Mem *)pPKey2)->u).pDef, (int)uVar20 < (int)(uint)*(ushort *)&pFVar3->pUserData
         )) {
        if ((CollSeq *)(&pFVar3->xFinalize)[(int)uVar20] == (CollSeq *)0x0) {
          uVar11 = pMem2->n;
          uVar21 = local_58 - uVar11;
          if ((int)local_58 < (int)uVar11) {
            uVar11 = local_58;
          }
          local_a8 = (Mem *)CONCAT44(local_a8._4_4_,(int)uVar18);
          uVar11 = memcmp((void *)((ulong)uVar15 + (long)pKey1),pMem2->z,(long)(int)uVar11);
          uVar18 = (ulong)local_a8 & 0xffffffff;
          if (uVar11 != 0) {
            uVar21 = uVar11;
          }
          uVar19 = (ulong)uVar21;
        }
        else {
          local_52 = (u8)pFVar3->funcFlags;
          local_50 = (sqlite3 *)pFVar3->pNext;
          local_54 = 2;
          local_60 = (ulong)uVar15 + (long)pKey1;
          uVar11 = vdbeCompareMemString
                             ((Mem *)&local_68,pMem2,(CollSeq *)(&pFVar3->xFinalize)[(int)uVar20],
                              local_88);
          uVar19 = (ulong)uVar11;
        }
        goto LAB_001440c3;
      }
      local_9c = 0;
      local_a8 = pMem2;
      local_98 = uVar14;
      sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x14d49,
                  "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
      *(u8 *)((long)&((Mem *)pPKey2)->db + 7) = '\v';
      iVar16 = 1;
      uVar14 = local_98;
      pMem2 = local_a8;
      goto LAB_00144170;
    }
    bVar7 = *(byte *)((long)pKey1 + uVar18);
    local_ac = (uint)bVar7;
    uVar19 = 1;
    if (9 < local_ac) goto LAB_001440c3;
    uVar11 = (uint)bVar7;
    uVar19 = 0xffffffff;
    if (uVar11 == 0) goto LAB_001440c3;
    if (uVar11 == 7) {
      local_a8 = (Mem *)CONCAT44(local_a8._4_4_,uVar17);
      sqlite3VdbeSerialGet((uchar *)((ulong)uVar15 + (long)pKey1),7,(Mem *)&local_68);
      uVar18 = (ulong)local_a8 & 0xffffffff;
      local_70 = (pMem2->u).i;
      uVar11 = -(uint)((double)CONCAT44(local_68.i._4_4_,local_68.nZero) < (double)local_70);
      if ((double)local_70 < (double)CONCAT44(local_68.i._4_4_,local_68.nZero)) {
        uVar11 = 1;
      }
      uVar19 = (ulong)uVar11;
      goto LAB_001440c3;
    }
    if (5 < bVar7 - 1) {
      uVar10 = (ulong)(uVar11 - 8);
      goto LAB_001440b3;
    }
    uVar9 = (ulong)uVar15;
    switch((uint)bVar7) {
    case 1:
      uVar10 = (ulong)*(char *)((long)pKey1 + uVar9);
      break;
    case 2:
      uVar12 = (long)*(char *)((long)pKey1 + uVar9) << 8;
      uVar10 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1);
      goto LAB_001440a2;
    case 3:
      uVar10 = (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 8 |
               (long)*(char *)((long)pKey1 + uVar9) << 0x10;
      bVar7 = *(byte *)((long)pKey1 + uVar9 + 2);
      goto LAB_0014408e;
    case 4:
      uVar10 = (ulong)*(byte *)((long)pKey1 + uVar9 + 2) << 8 |
               (long)(int)((uint)*(byte *)((long)pKey1 + uVar9) << 0x18) |
               (ulong)*(byte *)((long)pKey1 + uVar9 + 1) << 0x10;
      bVar7 = *(byte *)((long)pKey1 + uVar9 + 3);
LAB_0014408e:
      uVar10 = bVar7 | uVar10;
      break;
    case 5:
      uVar11 = *(uint *)((long)pKey1 + uVar9 + 2);
      uVar12 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                      uVar11 << 0x18);
      uVar10 = (ulong)(uint)(int)CONCAT11(*(undefined1 *)((long)pKey1 + uVar9),
                                          *(undefined1 *)((long)pKey1 + uVar9 + 1)) << 0x20;
LAB_001440a2:
      uVar10 = uVar10 | uVar12;
      break;
    case 6:
      uVar10 = *(ulong *)((long)pKey1 + uVar9);
      uVar10 = uVar10 >> 0x38 | (uVar10 & 0xff000000000000) >> 0x28 |
               (uVar10 & 0xff0000000000) >> 0x18 | (uVar10 & 0xff00000000) >> 8 |
               (uVar10 & 0xff000000) << 8 | (uVar10 & 0xff0000) << 0x18 | (uVar10 & 0xff00) << 0x28
               | uVar10 << 0x38;
    }
LAB_001440b3:
    if (((pMem2->u).i <= (long)uVar10) &&
       (uVar19 = uVar14 & 0xffffffff, (pMem2->u).i < (long)uVar10)) {
      uVar19 = 1;
    }
LAB_001440c3:
    if ((int)uVar19 == 0) {
      uVar20 = uVar20 + 1;
      if (uVar20 == *(u16 *)((long)&((Mem *)pPKey2)->db + 4)) {
        iVar16 = 2;
        uVar14 = 0;
      }
      else {
        uVar14 = (ulong)local_ac;
        if (uVar14 < 0x80) {
          uVar11 = (uint)""[uVar14];
        }
        else {
          uVar11 = local_ac - 0xc >> 1;
        }
        iVar16 = 1;
        if (0x7f < local_ac) {
          do {
            iVar16 = iVar16 + 1;
            bVar4 = 0x3fff < uVar14;
            uVar14 = uVar14 >> 7;
          } while (bVar4);
        }
        uVar15 = uVar11 + uVar15;
        uVar18 = (ulong)(uint)((int)uVar18 + iVar16);
        iVar16 = 0;
        uVar14 = 0;
        pMem2 = pMem2 + 1;
      }
    }
    else {
      bVar7 = (byte)((((Mem *)pPKey2)->u).pDef)->xSFunc[(int)uVar20];
      iVar16 = 1;
      if (bVar7 != 0) {
        if ((bVar7 & 2) != 0) {
          uVar13 = 1;
          if (local_ac != 0) {
            uVar13 = pMem2->flags & 1;
          }
          if ((bVar7 & 1) == uVar13) goto LAB_00144103;
        }
        uVar19 = (ulong)(uint)-(int)uVar19;
      }
LAB_00144103:
      local_9c = (int)uVar19;
      uVar14 = uVar19 & 0xffffffff;
    }
LAB_00144170:
    if (iVar16 == 0) {
      if ((uVar5 <= (uint)uVar18) || ((uint)nKey1 < uVar15)) goto LAB_0014427d;
      goto LAB_00143c07;
    }
    if (iVar16 != 2) {
      return local_9c;
    }
LAB_0014427d:
    *(u8 *)((long)&((Mem *)pPKey2)->szMalloc + 2) = '\x01';
    iVar16 = (int)*(i8 *)((long)&((Mem *)pPKey2)->db + 6);
  }
  return iVar16;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeRecordCompareWithSkip(
  int nKey1, const void *pKey1,   /* Left key */
  UnpackedRecord *pPKey2,         /* Right key */
  int bSkip                       /* If true, skip the first field */
){
  u32 d1;                         /* Offset into aKey[] of next data element */
  int i;                          /* Index of next field to compare */
  u32 szHdr1;                     /* Size of record header in bytes */
  u32 idx1;                       /* Offset of first type in header */
  int rc = 0;                     /* Return value */
  Mem *pRhs = pPKey2->aMem;       /* Next field of pPKey2 to compare */
  KeyInfo *pKeyInfo;
  const unsigned char *aKey1 = (const unsigned char *)pKey1;
  Mem mem1;

  /* If bSkip is true, then the caller has already determined that the first
  ** two elements in the keys are equal. Fix the various stack variables so
  ** that this routine begins comparing at the second field. */
  if( bSkip ){
    u32 s1 = aKey1[1];
    if( s1<0x80 ){
      idx1 = 2;
    }else{
      idx1 = 1 + sqlite3GetVarint32(&aKey1[1], &s1);
    }
    szHdr1 = aKey1[0];
    d1 = szHdr1 + sqlite3VdbeSerialTypeLen(s1);
    i = 1;
    pRhs++;
  }else{
    if( (szHdr1 = aKey1[0])<0x80 ){
      idx1 = 1;
    }else{
      idx1 = sqlite3GetVarint32(aKey1, &szHdr1);
    }
    d1 = szHdr1;
    i = 0;
  }
  if( d1>(unsigned)nKey1 ){
    pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
    return 0;  /* Corruption */
  }

  VVA_ONLY( mem1.szMalloc = 0; ) /* Only needed by assert() statements */
  assert( pPKey2->pKeyInfo->nAllField>=pPKey2->nField
       || CORRUPT_DB );
  assert( pPKey2->pKeyInfo->aSortFlags!=0 );
  assert( pPKey2->pKeyInfo->nKeyField>0 );
  assert( idx1<=szHdr1 || CORRUPT_DB );
  do{
    u32 serial_type;

    /* RHS is an integer */
    if( pRhs->flags & (MEM_Int|MEM_IntReal) ){
      testcase( pRhs->flags & MEM_Int );
      testcase( pRhs->flags & MEM_IntReal );
      serial_type = aKey1[idx1];
      testcase( serial_type==12 );
      if( serial_type>=10 ){
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else if( serial_type==7 ){
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        rc = -sqlite3IntFloatCompare(pRhs->u.i, mem1.u.r);
      }else{
        i64 lhs = vdbeRecordDecodeInt(serial_type, &aKey1[d1]);
        i64 rhs = pRhs->u.i;
        if( lhs<rhs ){
          rc = -1;
        }else if( lhs>rhs ){
          rc = +1;
        }
      }
    }

    /* RHS is real */
    else if( pRhs->flags & MEM_Real ){
      serial_type = aKey1[idx1];
      if( serial_type>=10 ){
        /* Serial types 12 or greater are strings and blobs (greater than
        ** numbers). Types 10 and 11 are currently "reserved for future
        ** use", so it doesn't really matter what the results of comparing
        ** them to numberic values are.  */
        rc = +1;
      }else if( serial_type==0 ){
        rc = -1;
      }else{
        sqlite3VdbeSerialGet(&aKey1[d1], serial_type, &mem1);
        if( serial_type==7 ){
          if( mem1.u.r<pRhs->u.r ){
            rc = -1;
          }else if( mem1.u.r>pRhs->u.r ){
            rc = +1;
          }
        }else{
          rc = sqlite3IntFloatCompare(mem1.u.i, pRhs->u.r);
        }
      }
    }

    /* RHS is a string */
    else if( pRhs->flags & MEM_Str ){
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 ){
        rc = -1;
      }else if( !(serial_type & 0x01) ){
        rc = +1;
      }else{
        mem1.n = (serial_type - 12) / 2;
        testcase( (d1+mem1.n)==(unsigned)nKey1 );
        testcase( (d1+mem1.n+1)==(unsigned)nKey1 );
        if( (d1+mem1.n) > (unsigned)nKey1
         || (pKeyInfo = pPKey2->pKeyInfo)->nAllField<=i
        ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pKeyInfo->aColl[i] ){
          mem1.enc = pKeyInfo->enc;
          mem1.db = pKeyInfo->db;
          mem1.flags = MEM_Str;
          mem1.z = (char*)&aKey1[d1];
          rc = vdbeCompareMemString(
              &mem1, pRhs, pKeyInfo->aColl[i], &pPKey2->errCode
          );
        }else{
          int nCmp = MIN(mem1.n, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = mem1.n - pRhs->n;
        }
      }
    }

    /* RHS is a blob */
    else if( pRhs->flags & MEM_Blob ){
      assert( (pRhs->flags & MEM_Zero)==0 || pRhs->n==0 );
      getVarint32NR(&aKey1[idx1], serial_type);
      testcase( serial_type==12 );
      if( serial_type<12 || (serial_type & 0x01) ){
        rc = -1;
      }else{
        int nStr = (serial_type - 12) / 2;
        testcase( (d1+nStr)==(unsigned)nKey1 );
        testcase( (d1+nStr+1)==(unsigned)nKey1 );
        if( (d1+nStr) > (unsigned)nKey1 ){
          pPKey2->errCode = (u8)SQLITE_CORRUPT_BKPT;
          return 0;                /* Corruption */
        }else if( pRhs->flags & MEM_Zero ){
          if( !isAllZero((const char*)&aKey1[d1],nStr) ){
            rc = 1;
          }else{
            rc = nStr - pRhs->u.nZero;
          }
        }else{
          int nCmp = MIN(nStr, pRhs->n);
          rc = memcmp(&aKey1[d1], pRhs->z, nCmp);
          if( rc==0 ) rc = nStr - pRhs->n;
        }
      }
    }

    /* RHS is null */
    else{
      serial_type = aKey1[idx1];
      rc = (serial_type!=0);
    }

    if( rc!=0 ){
      int sortFlags = pPKey2->pKeyInfo->aSortFlags[i];
      if( sortFlags ){
        if( (sortFlags & KEYINFO_ORDER_BIGNULL)==0
         || ((sortFlags & KEYINFO_ORDER_DESC)
           !=(serial_type==0 || (pRhs->flags&MEM_Null)))
        ){
          rc = -rc;
        }
      }
      assert( vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, rc) );
      assert( mem1.szMalloc==0 );  /* See comment below */
      return rc;
    }

    i++;
    if( i==pPKey2->nField ) break;
    pRhs++;
    d1 += sqlite3VdbeSerialTypeLen(serial_type);
    idx1 += sqlite3VarintLen(serial_type);
  }while( idx1<(unsigned)szHdr1 && d1<=(unsigned)nKey1 );

  /* No memory allocation is ever used on mem1.  Prove this using
  ** the following assert().  If the assert() fails, it indicates a
  ** memory leak and a need to call sqlite3VdbeMemRelease(&mem1).  */
  assert( mem1.szMalloc==0 );

  /* rc==0 here means that one or both of the keys ran out of fields and
  ** all the fields up to that point were equal. Return the default_rc
  ** value.  */
  assert( CORRUPT_DB
       || vdbeRecordCompareDebug(nKey1, pKey1, pPKey2, pPKey2->default_rc)
       || pPKey2->pKeyInfo->db->mallocFailed
  );
  pPKey2->eqSeen = 1;
  return pPKey2->default_rc;
}